

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

void QCss::Scanner::scan(QString *preprocessedInput,QList<QCss::Symbol> *symbols)

{
  TokenType TVar1;
  long in_FS_OFFSET;
  Symbol local_88;
  undefined1 local_58 [32];
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._0_8_ = (QArrayData *)0x0;
  local_58._8_8_ = (char16_t *)0x0;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._16_8_ = 0;
  QString::operator=((QString *)local_58,preprocessedInput);
  stack0xffffffffffffffc0 = (undefined1  [16])0x0;
  puStack_30 = (undefined1 *)0x0;
  local_88.token = NONE;
  local_88._4_4_ = 0xaaaaaaaa;
  local_88.text.d.d = (Data *)0x0;
  local_88.text.d.ptr._0_4_ = 0;
  local_88.text.d.ptr._4_4_ = 0;
  local_88.text.d.size = 0;
  local_88.start = 0;
  local_88.len = -1;
  TVar1 = QCssScanner_Generated::lex((QCssScanner_Generated *)local_58);
  if (TVar1 != ~NONE) {
    do {
      local_88.token = TVar1;
      QString::operator=(&local_88.text,(QString *)local_58);
      local_88.start = (int)local_38;
      local_88.len = (int)puStack_30;
      QtPrivate::QMovableArrayOps<QCss::Symbol>::emplace<QCss::Symbol_const&>
                ((QMovableArrayOps<QCss::Symbol> *)symbols,(symbols->d).size,&local_88);
      QList<QCss::Symbol>::end(symbols);
      TVar1 = QCssScanner_Generated::lex((QCssScanner_Generated *)local_58);
    } while (TVar1 != ~NONE);
  }
  if (&(local_88.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_58._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Scanner::scan(const QString &preprocessedInput, QList<Symbol> *symbols)
{
    QCssScanner_Generated scanner(preprocessedInput);
    Symbol sym;
    int tok = scanner.lex();
    while (tok != -1) {
        sym.token = static_cast<QCss::TokenType>(tok);
        sym.text = scanner.input;
        sym.start = scanner.lexemStart;
        sym.len = scanner.lexemLength;
        symbols->append(sym);
        tok = scanner.lex();
    }
}